

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::initFactorMatrix(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         **vec,
                  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *eps)

{
  long lVar1;
  bool bVar2;
  type_conflict5 tVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  int __c;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c_00;
  ulong extraout_RDX;
  long in_RSI;
  undefined4 *in_RDI;
  int j_3;
  int k_1;
  int end;
  int j_2;
  int j_1;
  int nnonzeros;
  int i_3;
  int i_2;
  int j;
  int k;
  int i_1;
  int i;
  int *sing;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *psv;
  Dring *lastcring;
  Dring *cring;
  Dring *lastrring;
  Dring *rring;
  int tot;
  int m;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  uint in_stack_fffffffffffff758;
  int in_stack_fffffffffffff75c;
  int in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff764;
  undefined1 local_86c [80];
  undefined1 local_81c [20];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff7f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff800;
  undefined1 local_7cc [160];
  undefined1 local_72c [80];
  undefined1 local_6dc [80];
  uint local_68c;
  int local_688;
  int local_684;
  undefined1 local_680 [80];
  undefined1 local_630 [40];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9f8;
  int in_stack_fffffffffffffa04;
  int in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa0c;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffa10;
  undefined1 local_5e0 [80];
  undefined1 local_590 [160];
  undefined1 local_4f0 [80];
  undefined1 local_4a0 [80];
  uint local_450;
  undefined1 local_44c [80];
  undefined1 local_3fc [80];
  int local_3ac;
  int local_3a8;
  int local_3a4;
  undefined4 local_3a0;
  int local_39c;
  undefined1 local_398 [80];
  undefined1 local_348 [80];
  undefined1 local_2f8 [80];
  uint local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  long local_298;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_290;
  long *local_288;
  long *local_280;
  long *local_278;
  long *local_270;
  int local_268;
  int local_264;
  undefined1 local_260 [88];
  long local_208;
  undefined1 *local_1f8;
  undefined4 *local_1f0;
  undefined4 *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined4 *local_128;
  undefined1 *local_120;
  undefined4 *local_118;
  undefined1 *local_110;
  reference local_108;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined1 *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined4 *local_e0;
  long local_d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c9;
  int *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  int *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  int *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  int *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  int *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  ulong uVar8;
  
  local_1f8 = local_260;
  local_208 = in_RSI;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
  local_298 = *(long *)(in_RDI + 0xd2);
  for (local_29c = 0; local_29c < (int)in_RDI[1]; local_29c = local_29c + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0xac) + (long)local_29c * 4) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 0xae) + (long)local_29c * 4) = 0;
  }
  local_268 = 0;
  for (local_2a0 = 0; local_2a0 < (int)in_RDI[1]; local_2a0 = local_2a0 + 1) {
    local_290 = *(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(local_208 + (long)local_2a0 * 8);
    local_2a4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_290);
    if (local_2a4 < 2) {
      if (local_2a4 == 0) {
        *in_RDI = 2;
        return;
      }
    }
    else {
      local_268 = local_2a4 + local_268;
      uVar8 = extraout_RDX;
      for (local_2a8 = 0; (int)local_2a8 < local_2a4; local_2a8 = local_2a8 + 1) {
        lVar1 = *(long *)(in_RDI + 0xae);
        pcVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::index(local_290,(char *)(ulong)local_2a8,(int)uVar8);
        uVar7 = *(int *)(lVar1 + (long)(int)pcVar6 * 4) + 1;
        uVar8 = (ulong)uVar7;
        *(uint *)(lVar1 + (long)(int)pcVar6 * 4) = uVar7;
      }
    }
  }
  local_30 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 0x2b);
  local_28 = local_2f8;
  local_38 = &local_268;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_30);
  local_20 = local_2f8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
  local_8 = local_2f8;
  local_10 = local_30;
  local_18 = local_38;
  local_48 = (long)*local_38;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),(longlong *)0x534dad);
  boost::multiprecision::number::operator_cast_to_int
            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)0x534dba);
  minRowMem((CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
            in_stack_fffffffffffff75c);
  local_78 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 0x3f);
  local_70 = local_348;
  local_80 = &local_268;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_81,local_78);
  local_68 = local_348;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
  local_50 = local_348;
  local_58 = local_78;
  local_60 = local_80;
  local_90 = (long)*local_80;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),(longlong *)0x534e8b);
  boost::multiprecision::number::operator_cast_to_int
            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)0x534e98);
  minColMem((CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
            in_stack_fffffffffffff75c);
  local_c0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 0x53);
  local_b8 = local_398;
  local_c8 = &local_268;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_c9,local_c0);
  local_b0 = local_398;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
  local_98 = local_398;
  local_a0 = local_c0;
  local_a8 = local_c8;
  local_d8 = (long)*local_c8;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),(longlong *)0x534f69);
  boost::multiprecision::number::operator_cast_to_int
            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)0x534f76);
  minLMem((CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),in_stack_fffffffffffff75c
         );
  **(undefined4 **)(in_RDI + 0xaa) = 0;
  local_270 = *(long **)(in_RDI + 0x9e);
  local_278 = (long *)(in_RDI + 0x98);
  in_RDI[0x9c] = in_RDI[1];
  *local_278 = (long)local_270;
  local_280 = *(long **)(in_RDI + 0xb6);
  local_288 = (long *)(in_RDI + 0xb0);
  in_RDI[0xb4] = in_RDI[1];
  *local_288 = (long)local_280;
  local_264 = 0;
  for (local_39c = 0; local_39c < (int)in_RDI[1]; local_39c = local_39c + 1) {
    *(int *)(*(long *)(in_RDI + 0xaa) + (long)local_39c * 4) = local_264;
    local_264 = *(int *)(*(long *)(in_RDI + 0xae) + (long)local_39c * 4) + local_264;
    *(int *)(local_270 + 2) = local_39c;
    local_270[1] = (long)local_278;
    *local_278 = (long)local_270;
    local_278 = local_270;
    local_270 = local_270 + 3;
    *(int *)(local_280 + 2) = local_39c;
    local_280[1] = (long)local_288;
    *local_288 = (long)local_280;
    local_288 = local_280;
    local_280 = local_280 + 3;
  }
  *(undefined4 *)(*(long *)(in_RDI + 0xaa) + (long)(int)in_RDI[1] * 4) = 0;
  *(undefined4 *)(*(long *)(in_RDI + 0xae) + (long)(int)in_RDI[1] * 4) = 0;
  in_RDI[0xa1] = local_264;
  *local_278 = (long)(in_RDI + 0x98);
  *(long **)(*local_278 + 8) = local_278;
  *local_288 = (long)(in_RDI + 0xb0);
  *(long **)(*local_288 + 8) = local_288;
  local_264 = 0;
  in_RDI[0xdc] = 0;
  local_3a0 = 0;
  local_1e8 = in_RDI + 3;
  local_1f0 = &local_3a0;
  local_e0 = local_1f0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  local_3a4 = 0;
  while( true ) {
    if ((int)in_RDI[1] <= local_3a4) {
      in_RDI[0xb9] = local_264;
      return;
    }
    local_290 = *(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(local_208 + (long)local_3a4 * 8);
    *(int *)(*(long *)(in_RDI + 0xc2) + (long)local_3a4 * 4) = local_264;
    local_3a8 = 0;
    for (local_3ac = 0; iVar5 = local_3ac,
        iVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_290), iVar5 < iVar4 && local_3a8 < 2; local_3ac = local_3ac + 1) {
      local_1e0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::value(local_290,local_3ac);
      local_1d8 = local_3fc;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      local_1c8 = local_44c;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
      if (bVar2) {
        local_3a8 = local_3a8 + 1;
      }
    }
    if (local_3a8 == 0) break;
    if (local_3a8 == 1) {
      local_450 = 0;
      while( true ) {
        local_1c0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::value(local_290,local_450);
        local_1b8 = local_4a0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        local_1a8 = local_4f0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
        if (!bVar2) break;
        local_450 = local_450 + 1;
      }
      lVar1 = *(long *)(in_RDI + 0x6a);
      pcVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::index(local_290,(char *)(ulong)local_450,__c);
      if (-1 < *(int *)(lVar1 + (long)(int)pcVar6 * 4)) {
        *in_RDI = 2;
        return;
      }
      local_f0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::value(local_290,local_450);
      local_e8 = local_260;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      local_198 = local_590;
      local_1a0 = local_260;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x535580);
      iVar5 = extraout_EDX;
      if (tVar3) {
        local_188 = local_630;
        local_190 = local_260;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        local_118 = in_RDI + 3;
        local_120 = local_5e0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        iVar5 = extraout_EDX_00;
      }
      in_stack_fffffffffffff75c = in_RDI[0xdc];
      in_stack_fffffffffffff760 = local_3a4;
      pcVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::index(local_290,(char *)(ulong)local_450,iVar5);
      in_stack_fffffffffffff764 = SUB84(pcVar6,0);
      local_178 = local_680;
      local_180 = local_260;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      setPivot(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08,
               in_stack_fffffffffffffa04,in_stack_fffffffffffff9f8);
      *(int *)(local_298 + (long)(int)in_RDI[0xdc] * 4) = local_3a4;
      in_RDI[0xdc] = in_RDI[0xdc] + 1;
      *(undefined4 *)(*(long *)(in_RDI + 0xc6) + (long)local_3a4 * 4) = 0;
      *(undefined4 *)(*(long *)(in_RDI + 0xc4) + (long)local_3a4 * 4) = 0;
      *(undefined4 *)(*(long *)(in_RDI + 0xda) + (long)local_3a4 * 4) = 0;
    }
    else {
      local_3a8 = 0;
      local_68c = 0;
      while (in_stack_fffffffffffff758 = local_68c,
            iVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(local_290), (int)in_stack_fffffffffffff758 < iVar5) {
        local_100 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::value(local_290,local_68c);
        local_f8 = local_260;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        local_168 = local_6dc;
        local_170 = local_260;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        local_158 = local_72c;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
        if (bVar2) {
          pcVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::index(local_290,(char *)(ulong)local_68c,__c_00);
          local_688 = (int)pcVar6;
          *(int *)(*(long *)(in_RDI + 0xba) + (long)local_264 * 4) = local_688;
          local_264 = local_264 + 1;
          local_684 = *(int *)(*(long *)(in_RDI + 0xaa) + (long)local_688 * 4) +
                      *(int *)(*(long *)(in_RDI + 0xac) + (long)local_688 * 4);
          *(int *)(*(long *)(in_RDI + 0xa8) + (long)local_684 * 4) = local_3a4;
          local_108 = std::
                      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)(in_RDI + 0xa2),(long)local_684);
          local_110 = local_260;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    ((cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
          *(int *)(*(long *)(in_RDI + 0xac) + (long)local_688 * 4) =
               *(int *)(*(long *)(in_RDI + 0xac) + (long)local_688 * 4) + 1;
          local_148 = local_7cc;
          local_150 = local_260;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
          spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x535952);
          if (tVar3) {
            local_138 = local_86c;
            local_140 = local_260;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<100U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                       (cpp_dec_float<100U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
            spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
            local_128 = in_RDI + 3;
            local_130 = local_81c;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      ((cpp_dec_float<100U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                       (cpp_dec_float<100U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
          }
          local_3a8 = local_3a8 + 1;
        }
        local_68c = local_68c + 1;
      }
      *(int *)(*(long *)(in_RDI + 0xc6) + (long)local_3a4 * 4) = local_3a8;
      *(int *)(*(long *)(in_RDI + 0xc4) + (long)local_3a4 * 4) = local_3a8;
      *(int *)(*(long *)(in_RDI + 0xda) + (long)local_3a4 * 4) = local_3a8;
    }
    local_3a4 = local_3a4 + 1;
  }
  *in_RDI = 2;
  return;
}

Assistant:

void CLUFactor<R>::initFactorMatrix(const SVectorBase<R>** vec, const R eps)
{

   R x;
   int m;
   int tot;
   Dring* rring, *lastrring;
   Dring* cring, *lastcring;
   const SVectorBase<R>* psv;
   int* sing = temp.s_mark;

   /*  Initialize:
    *  - column file thereby remembering column singletons in |sing|.
    *  - nonzeros counts per row
    *  - total number of nonzeros
    */

   for(int i = 0; i < thedim; i++)
      u.row.max[i] = u.row.len[i] = 0;

   tot = 0;

   for(int i = 0; i < thedim; i++)
   {
      int k;

      psv = vec[i];
      k = psv->size();

      if(k > 1)
      {
         tot += k;

         for(int j = 0; j < k; ++j)
            u.row.max[psv->index(j)]++;
      }
      else if(k == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }
   }

   /*  Resize nonzero memory if necessary
    */
   minRowMem(int(rowMemMult * tot));

   minColMem(int(colMemMult * tot));

   minLMem(int(lMemMult * tot));


   /*  Initialize:
    *  - row ring lists
    *  - row vectors in file
    *  - column ring lists
    */
   u.row.start[0] = 0;

   rring = u.row.elem;

   lastrring = &(u.row.list);

   lastrring->idx = thedim;

   lastrring->next = rring;

   cring = u.col.elem;

   lastcring = &(u.col.list);

   lastcring->idx = thedim;

   lastcring->next = cring;

   m = 0;

   for(int i = 0; i < thedim; i++)
   {
      u.row.start[i] = m;
      m += u.row.max[i];

      rring->idx = i;
      rring->prev = lastrring;
      lastrring->next = rring;
      lastrring = rring;
      ++rring;

      cring->idx = i;
      cring->prev = lastcring;
      lastcring->next = cring;
      lastcring = cring;
      ++cring;
   }

   u.row.start[thedim]       = 0;

   u.row.max[thedim]       = 0;
   u.row.used = m;

   lastrring->next = &(u.row.list);
   lastrring->next->prev = lastrring;

   lastcring->next = &(u.col.list);
   lastcring->next->prev = lastcring;

   /*  Copy matrix to row and column file
    *  excluding and marking column singletons!
    */
   m = 0;
   temp.stage = 0;

   initMaxabs = 0;

   for(int i = 0; i < thedim; i++)
   {
      int nnonzeros;

      psv = vec[i];
      u.col.start[i] = m;

      /* check whether number of nonzeros above tolerance is 0, 1 or >= 2 */
      nnonzeros = 0;

      for(int j = 0; j < psv->size() && nnonzeros <= 1; j++)
      {
         if(isNotZero(psv->value(j), eps))
            nnonzeros++;
      }

      /* basis is singular due to empty column */
      if(nnonzeros == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }

      /* exclude column singletons */
      else if(nnonzeros == 1)
      {
         int j = 0;

         /* find nonzero */

         for(j = 0; isZero(psv->value(j), eps); j++)
            ;

         assert(j < psv->size());

         /* basis is singular due to two linearly dependent column singletons */
         if(row.perm[psv->index(j)] >= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         /* update maximum absolute nonzero value */
         x = psv->value(j);

         if(spxAbs(x) > initMaxabs)
            initMaxabs = spxAbs(x);

         /* permute to front and mark as singleton */
         setPivot(temp.stage, i, psv->index(j), x);

         sing[temp.stage] = i;

         temp.stage++;

         /* set column length to zero */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = 0;
      }

      /* add to active matrix if not a column singleton */
      else
      {
         int end;
         int k;

         /* go through all nonzeros in column */
         assert(nnonzeros >= 2);
         nnonzeros = 0;

         for(int j = 0; j < psv->size(); j++)
         {
            x = psv->value(j);

            if(isNotZero(x, eps))
            {
               /* add to column array */
               k = psv->index(j);
               u.col.idx[m] = k;
               m++;

               /* add to row array */
               end = u.row.start[k] + u.row.len[k];
               u.row.idx[end] = i;
               u.row.val[end] = x;
               u.row.len[k]++;

               /* update maximum absolute nonzero value */

               if(spxAbs(x) > initMaxabs)
                  initMaxabs = spxAbs(x);

               nnonzeros++;
            }
         }

         assert(nnonzeros >= 2);

         /* set column length */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = nnonzeros;
      }
   }

   u.col.used = m;
}